

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
* __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::Clone
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this_00;
  
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *)operator_new(0x68);
  IteratorImpl(this_00,this);
  return &this_00->
          super_ParamIteratorInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
  ;
}

Assistant:

ParamIteratorInterface<ParamType>* Clone() const override {
      return new IteratorImpl(*this);
    }